

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBufferDescriptor.h
# Opt level: O3

void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(int32_t termLength)

{
  char *pcVar1;
  long *plVar2;
  SourcedException *pSVar3;
  char *pcVar4;
  size_type *psVar5;
  char *pcVar6;
  allocator local_109;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (termLength < 0x10000) {
    pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_e8,0x10000);
    std::operator+(&local_c8,"term length less than min size of ",&local_e8);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)*plVar2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_108._M_dataplus._M_p == psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar2[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
    }
    local_108._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string(&local_68,termLength);
    std::operator+(&local_a8,&local_108,&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,"");
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
    ;
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
    do {
      pcVar4 = pcVar4 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar4 == *pcVar1);
    std::__cxx11::string::string((string *)&local_48,pcVar6 + (*pcVar1 == '/'),&local_109);
    util::SourcedException::SourcedException(pSVar3,&local_a8,&local_88,&local_48,0x9c);
    *(undefined ***)pSVar3 = &PTR__SourcedException_00163468;
    __cxa_throw(pSVar3,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if ((uint)termLength < 0x40000001) {
    if ((termLength + 0x7fffffffU & termLength) == 0) {
      return;
    }
    pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_108,termLength);
    std::operator+(&local_a8,"term length not a power of 2, length=",&local_108);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,"");
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
    ;
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
    do {
      pcVar4 = pcVar4 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar4 == *pcVar1);
    std::__cxx11::string::string
              ((string *)&local_e8,pcVar6 + (*pcVar1 == '/'),(allocator *)&local_68);
    util::SourcedException::SourcedException(pSVar3,&local_a8,&local_c8,&local_e8,0xa9);
    *(undefined ***)pSVar3 = &PTR__SourcedException_00163468;
    __cxa_throw(pSVar3,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_e8,0x40000000);
  std::operator+(&local_c8,"term length greater than max size of ",&local_e8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_108._M_dataplus._M_p = (pointer)*plVar2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_108._M_dataplus._M_p == psVar5) {
    local_108.field_2._M_allocated_capacity = *psVar5;
    local_108.field_2._8_8_ = plVar2[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar5;
  }
  local_108._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_68,termLength);
  std::operator+(&local_a8,&local_108,&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
             ,"");
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
  ;
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar4 = pcVar4 + 1;
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar4 == *pcVar1);
  std::__cxx11::string::string((string *)&local_48,pcVar6 + (*pcVar1 == '/'),&local_109);
  util::SourcedException::SourcedException(pSVar3,&local_a8,&local_88,&local_48,0xa3);
  *(undefined ***)pSVar3 = &PTR__SourcedException_00163468;
  __cxa_throw(pSVar3,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void checkTermLength(std::int32_t termLength)
{
    if (termLength < TERM_MIN_LENGTH)
    {
        throw util::IllegalStateException(
            "term length less than min size of " + std::to_string(TERM_MIN_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (termLength > TERM_MAX_LENGTH)
    {
        throw util::IllegalStateException(
            "term length greater than max size of " + std::to_string(TERM_MAX_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (!util::BitUtil::isPowerOfTwo(termLength))
    {
        throw util::IllegalStateException(
            "term length not a power of 2, length=" + std::to_string(termLength), SOURCEINFO);
    }
}